

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

natwm_error parser_read_key(parser *parser,char **result,size_t *length)

{
  char c;
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  parser_token pVar4;
  natwm_error nVar5;
  undefined8 uVar6;
  size_t local_58;
  size_t equal_pos;
  size_t stripped_key_length;
  char *local_40;
  char *stripped_key;
  char *key;
  
  uVar6 = 0x106e8b;
  pcVar1 = parser->buffer;
  sVar2 = parser->pos;
  c = pcVar1[sVar2];
  stripped_key_length = (size_t)length;
  pVar4 = char_to_token(c);
  sVar3 = stripped_key_length;
  if (pVar4 == ALPHA_CHAR) {
    local_58 = 0;
    stripped_key = (char *)0x0;
    nVar5 = string_get_delimiter(pcVar1 + sVar2,'=',&stripped_key,&local_58,false);
    if (nVar5 == NO_ERROR) {
      local_40 = (char *)0x0;
      equal_pos = 0;
      nVar5 = string_strip_surrounding_spaces(stripped_key,&local_40,&equal_pos);
      if (nVar5 == NO_ERROR) {
        free(stripped_key);
        parser_move(parser,local_58);
        *result = local_40;
        if (sVar3 == 0) {
          return NO_ERROR;
        }
        *(size_t *)sVar3 = equal_pos;
        return NO_ERROR;
      }
      internal_logger(natwm_logger,LEVEL_ERROR,"Invalid config value - Line %zu",parser->line_num);
      free(stripped_key);
      free(local_40);
    }
    else {
      internal_logger(natwm_logger,LEVEL_ERROR,"Missing \'=\' - Line: %zu",parser->line_num);
    }
  }
  else {
    internal_logger(natwm_logger,LEVEL_ERROR,"Invalid Key: \'%c\' - Line: %zu Col: %zu",
                    (ulong)(uint)(int)c,parser->line_num,parser->col_num,uVar6);
  }
  return INVALID_INPUT_ERROR;
}

Assistant:

enum natwm_error parser_read_key(struct parser *parser, char **result, size_t *length)
{
        enum natwm_error err = GENERIC_ERROR;
        const char *line = parser->buffer + parser->pos;

        if (char_to_token(line[0]) != ALPHA_CHAR) {
                LOG_ERROR(natwm_logger,
                          "Invalid Key: '%c' - Line: %zu Col: %zu",
                          line[0],
                          parser->line_num,
                          parser->col_num);

                return INVALID_INPUT_ERROR;
        }

        // Find the EQUAL_CHAR which will allows us to know the bounds of the
        // key
        size_t equal_pos = 0;
        char *key = NULL;

        err = string_get_delimiter(line, '=', &key, &equal_pos, false);

        if (err != NO_ERROR) {
                LOG_ERROR(natwm_logger, "Missing '=' - Line: %zu", parser->line_num);

                return INVALID_INPUT_ERROR;
        }

        // We should now be able to strip the spaces around the key which will
        // leave us with a valid key
        char *stripped_key = NULL;
        size_t stripped_key_length = 0;

        err = string_strip_surrounding_spaces(key, &stripped_key, &stripped_key_length);

        if (err != NO_ERROR) {
                LOG_ERROR(natwm_logger, "Invalid config value - Line %zu", parser->line_num);

                free(key);
                free(stripped_key);

                return INVALID_INPUT_ERROR;
        }

        // Cleanup the intermediate key
        free(key);

        // Update the buffer position to the equal pos
        parser_move(parser, equal_pos);

        // Now we can return our valid key and key length
        *result = stripped_key;

        SET_IF_NON_NULL(length, stripped_key_length);

        return NO_ERROR;
}